

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeFont(ImFont *font)

{
  ImVec2 pos;
  bool bVar1;
  ImGuiIO *pIVar2;
  char *pcVar3;
  ImFontConfig *pIVar4;
  ImGuiStyle *pIVar5;
  ImFontGlyph *pIVar6;
  ImFont *in_RDI;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  ImVec2 *unaff_retaddr;
  ImVec2 *in_stack_00000008;
  ImDrawList *in_stack_00000010;
  ImFontGlyph *glyph;
  ImVec2 cell_p2;
  ImVec2 cell_p1;
  uint n_1;
  ImVec2 base_pos;
  uint n;
  int count;
  uint base;
  float cell_spacing;
  float cell_size;
  ImU32 glyph_col;
  ImDrawList *draw_list;
  ImFontConfig *cfg;
  int config_i;
  int surface_sqrt;
  char c_str [5];
  bool opened;
  uint in_stack_ffffffffffffff6c;
  ImFont *in_stack_ffffffffffffff70;
  ImFont *this;
  ImVec2 in_stack_ffffffffffffff88;
  ImVec2 *in_stack_ffffffffffffff90;
  ImVec2 *in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  float fStack_50;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint c_begin;
  uint local_18;
  float in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  uint flags;
  ImFont *pIVar14;
  
  if (in_RDI->ConfigData == (ImFontConfig *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = in_RDI->ConfigData->Name;
  }
  this = in_RDI;
  bVar1 = TreeNode((void *)(double)in_RDI->FontSize,(char *)in_RDI,
                   "Font: \"%s\"\n%.2f px, %d glyphs, %d file(s)",pcVar3,
                   (ulong)(uint)(in_RDI->Glyphs).Size,(ulong)(uint)(int)in_RDI->ConfigDataCount);
  fVar8 = (float)((ulong)pcVar3 >> 0x20);
  flags = CONCAT13(bVar1,(int3)in_stack_fffffffffffffff4);
  SameLine((float)((ulong)in_stack_ffffffffffffff70 >> 0x20),SUB84(in_stack_ffffffffffffff70,0));
  bVar1 = SmallButton((char *)in_RDI);
  if (bVar1) {
    pIVar14 = this;
    pIVar2 = GetIO();
    pIVar2->FontDefault = this;
    in_stack_ffffffffffffff70 = this;
    this = pIVar14;
  }
  if ((flags & 0x1000000) != 0) {
    PushFont(in_stack_ffffffffffffff70);
    Text("The quick brown fox jumps over the lazy dog");
    PopFont();
    fVar7 = GetFontSize();
    SetNextItemWidth(fVar7 * 8.0);
    DragFloat((char *)in_stack_ffffffffffffff90,(float *)in_stack_ffffffffffffff88,
              (float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),fVar8,(char *)in_stack_ffffffffffffff70
              ,in_stack_ffffffffffffff6c);
    SameLine((float)((ulong)in_stack_ffffffffffffff70 >> 0x20),SUB84(in_stack_ffffffffffffff70,0));
    MetricsHelpMarker((char *)0x138031);
    Text((char *)(double)this->Ascent,(double)this->Descent,(double)(this->Ascent - this->Descent),
         "Ascent: %f, Descent: %f, Height: %f");
    pcVar3 = ImTextCharToUtf8((char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    Text("Fallback character: \'%s\' (U+%04X)",pcVar3,(ulong)this->FallbackChar);
    pcVar3 = ImTextCharToUtf8((char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    Text("Ellipsis character: \'%s\' (U+%04X)",pcVar3,(ulong)this->EllipsisChar);
    fVar8 = sqrtf((float)this->MetricsTotalSurface);
    Text("Texture Area: about %d px ~%dx%d px",(ulong)(uint)this->MetricsTotalSurface,
         (ulong)(uint)(int)fVar8,(ulong)(uint)(int)fVar8);
    for (local_18 = 0; (int)local_18 < (int)this->ConfigDataCount; local_18 = local_18 + 1) {
      if ((this->ConfigData != (ImFontConfig *)0x0) &&
         (pIVar4 = this->ConfigData + (int)local_18, pIVar4 != (ImFontConfig *)0x0)) {
        BulletText((char *)(double)(pIVar4->GlyphOffset).x,(double)(pIVar4->GlyphOffset).y,
                   "Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d, Offset: (%.1f,%.1f)",
                   (ulong)local_18,pIVar4->Name,(ulong)(uint)pIVar4->OversampleH,
                   (ulong)(uint)pIVar4->OversampleV,(ulong)(pIVar4->PixelSnapH & 1));
      }
    }
    bVar1 = TreeNode("Glyphs","Glyphs (%d)",(ulong)(uint)(this->Glyphs).Size);
    if (bVar1) {
      GetWindowDrawList();
      fVar7 = (float)GetColorU32((ImGuiCol)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
      fVar9 = this->FontSize * 1.0;
      pIVar5 = GetStyle();
      fVar8 = (pIVar5->ItemSpacing).y;
      for (c_begin = 0; c_begin < 0x10000; c_begin = c_begin + 0x100) {
        if (((c_begin & 0xfff) == 0) &&
           (bVar1 = ImFont::IsGlyphRangeUnused(this,c_begin,c_begin + 0xfff), bVar1)) {
          c_begin = c_begin + 0xf00;
        }
        else {
          uVar13 = 0;
          for (uVar12 = 0; uVar12 < 0x100; uVar12 = uVar12 + 1) {
            pIVar6 = ImFont::FindGlyphNoFallback(this,(short)c_begin + (short)uVar12);
            if (pIVar6 != (ImFontGlyph *)0x0) {
              uVar13 = uVar13 + 1;
            }
          }
          if (0 < (int)uVar13) {
            pcVar3 = "glyph";
            if (1 < (int)uVar13) {
              pcVar3 = "glyphs";
            }
            bVar1 = TreeNode((void *)(ulong)c_begin,"U+%04X..U+%04X (%d %s)",(ulong)c_begin,
                             (ulong)(c_begin + 0xff),(ulong)uVar13,pcVar3);
            if (bVar1) {
              IVar10 = GetCursorScreenPos();
              for (uVar11 = 0; uVar11 < 0x100; uVar11 = uVar11 + 1) {
                ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffac,
                               (float)(uVar11 & 0xf) * (fVar9 + fVar8) + IVar10.x,
                               (float)(uVar11 >> 4) * (fVar9 + fVar8) + IVar10.y);
                ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa4,in_stack_ffffffffffffffac + fVar9,
                               fStack_50 + fVar9);
                pIVar6 = ImFont::FindGlyphNoFallback(this,(short)c_begin + (short)uVar11);
                ImDrawList::AddRect(in_stack_00000010,in_stack_00000008,unaff_retaddr,
                                    (ImU32)((ulong)this >> 0x20),SUB84(this,0),flags,
                                    in_stack_fffffffffffffff0);
                if (pIVar6 != (ImFontGlyph *)0x0) {
                  in_stack_ffffffffffffff90 =
                       (ImVec2 *)CONCAT44(fStack_50,in_stack_ffffffffffffffac);
                  pos.y = fVar7;
                  pos.x = fVar9;
                  ImFont::RenderChar((ImFont *)CONCAT44(fVar8,c_begin),
                                     (ImDrawList *)CONCAT44(uVar13,uVar12),IVar10.y,pos,
                                     (ImU32)IVar10.x,(ImWchar)(uVar11 >> 0x10));
                }
                if ((pIVar6 != (ImFontGlyph *)0x0) &&
                   (bVar1 = IsMouseHoveringRect((ImVec2 *)
                                                CONCAT44(in_stack_ffffffffffffffac,
                                                         in_stack_ffffffffffffffa8),
                                                in_stack_ffffffffffffffa0,
                                                SUB81((ulong)pIVar6 >> 0x38,0)), bVar1)) {
                  BeginTooltip();
                  Text("Codepoint: U+%04X",(ulong)(c_begin + uVar11));
                  Separator();
                  Text("Visible: %d",(ulong)(*(uint *)pIVar6 >> 1 & 1));
                  Text((char *)(double)pIVar6->AdvanceX,"AdvanceX: %.1f");
                  Text((char *)(double)pIVar6->X0,(double)pIVar6->Y0,(double)pIVar6->X1,
                       (double)pIVar6->Y1,"Pos: (%.2f,%.2f)->(%.2f,%.2f)");
                  Text((char *)(double)pIVar6->U0,(double)pIVar6->V0,(double)pIVar6->U1,
                       (double)pIVar6->V1,"UV: (%.3f,%.3f)->(%.3f,%.3f)");
                  EndTooltip();
                }
              }
              ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,(fVar9 + fVar8) * 16.0,
                             (fVar9 + fVar8) * 16.0);
              Dummy(in_stack_ffffffffffffff90);
              TreePop();
            }
          }
        }
      }
      TreePop();
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeFont(ImFont* font)
{
    bool opened = TreeNode(font, "Font: \"%s\"\n%.2f px, %d glyphs, %d file(s)",
        font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size, font->ConfigDataCount);
    SameLine();
    if (SmallButton("Set as default"))
        GetIO().FontDefault = font;
    if (!opened)
        return;

    // Display preview text
    PushFont(font);
    Text("The quick brown fox jumps over the lazy dog");
    PopFont();

    // Display details
    SetNextItemWidth(GetFontSize() * 8);
    DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");
    SameLine(); MetricsHelpMarker(
        "Note than the default embedded font is NOT meant to be scaled.\n\n"
        "Font are currently rendered into bitmaps at a given size at the time of building the atlas. "
        "You may oversample them to get some flexibility with scaling. "
        "You can also render at multiple sizes and select which one to use at runtime.\n\n"
        "(Glimmer of hope: the atlas system will be rewritten in the future to make scaling more flexible.)");
    Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
    char c_str[5];
    Text("Fallback character: '%s' (U+%04X)", ImTextCharToUtf8(c_str, font->FallbackChar), font->FallbackChar);
    Text("Ellipsis character: '%s' (U+%04X)", ImTextCharToUtf8(c_str, font->EllipsisChar), font->EllipsisChar);
    const int surface_sqrt = (int)ImSqrt((float)font->MetricsTotalSurface);
    Text("Texture Area: about %d px ~%dx%d px", font->MetricsTotalSurface, surface_sqrt, surface_sqrt);
    for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
        if (font->ConfigData)
            if (const ImFontConfig* cfg = &font->ConfigData[config_i])
                BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d, Offset: (%.1f,%.1f)",
                    config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH, cfg->GlyphOffset.x, cfg->GlyphOffset.y);

    // Display all glyphs of the fonts in separate pages of 256 characters
    if (TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
    {
        ImDrawList* draw_list = GetWindowDrawList();
        const ImU32 glyph_col = GetColorU32(ImGuiCol_Text);
        const float cell_size = font->FontSize * 1;
        const float cell_spacing = GetStyle().ItemSpacing.y;
        for (unsigned int base = 0; base <= IM_UNICODE_CODEPOINT_MAX; base += 256)
        {
            // Skip ahead if a large bunch of glyphs are not present in the font (test in chunks of 4k)
            // This is only a small optimization to reduce the number of iterations when IM_UNICODE_MAX_CODEPOINT
            // is large // (if ImWchar==ImWchar32 we will do at least about 272 queries here)
            if (!(base & 4095) && font->IsGlyphRangeUnused(base, base + 4095))
            {
                base += 4096 - 256;
                continue;
            }

            int count = 0;
            for (unsigned int n = 0; n < 256; n++)
                if (font->FindGlyphNoFallback((ImWchar)(base + n)))
                    count++;
            if (count <= 0)
                continue;
            if (!TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base + 255, count, count > 1 ? "glyphs" : "glyph"))
                continue;

            // Draw a 16x16 grid of glyphs
            ImVec2 base_pos = GetCursorScreenPos();
            for (unsigned int n = 0; n < 256; n++)
            {
                // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions
                // available here and thus cannot easily generate a zero-terminated UTF-8 encoded string.
                ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base + n));
                draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255, 255, 255, 100) : IM_COL32(255, 255, 255, 50));
                if (glyph)
                    font->RenderChar(draw_list, cell_size, cell_p1, glyph_col, (ImWchar)(base + n));
                if (glyph && IsMouseHoveringRect(cell_p1, cell_p2))
                {
                    BeginTooltip();
                    Text("Codepoint: U+%04X", base + n);
                    Separator();
                    Text("Visible: %d", glyph->Visible);
                    Text("AdvanceX: %.1f", glyph->AdvanceX);
                    Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
                    Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
                    EndTooltip();
                }
            }
            Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
            TreePop();
        }
        TreePop();
    }
    TreePop();
}